

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)>::
PerformDefaultAction
          (FunctionMocker<pstore::address_(unsigned_long,_unsigned_int)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<pstore::address_(unsigned_long,_unsigned_int)> *this_00;
  Action<pstore::address_(unsigned_long,_unsigned_int)> *this_01;
  Result RVar1;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ArgumentTuple local_20;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<pstore::address_(unsigned_long,_unsigned_int)> *)0x0) {
    std::operator+(&local_40,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar1.a_ = (value_type)DefaultValue<pstore::address>::Get();
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    this_01 = OnCallSpec<pstore::address_(unsigned_long,_unsigned_int)>::GetAction(this_00);
    local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
    super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_int,_false>)
         (args->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
         super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
         _M_head_impl;
    local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (args->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    RVar1 = Action<pstore::address_(unsigned_long,_unsigned_int)>::Perform(this_01,&local_20);
  }
  return (Result)RVar1.a_;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }